

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O0

void __thiscall
p2t::Sweep::FillRightConcaveEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  Orientation OVar1;
  Node *node_local;
  Edge *edge_local;
  SweepContext *tcx_local;
  Sweep *this_local;
  
  Fill(this,tcx,node->next);
  if (((node->next->point != edge->p) &&
      (OVar1 = Orient2d(edge->q,node->next->point,edge->p), OVar1 == CCW)) &&
     (OVar1 = Orient2d(node->point,node->next->point,node->next->next->point), OVar1 == CCW)) {
    FillRightConcaveEdgeEvent(this,tcx,edge,node);
  }
  return;
}

Assistant:

void Sweep::FillRightConcaveEdgeEvent(SweepContext& tcx, Edge* edge, Node& node)
{
  Fill(tcx, *node.next);
  if (node.next->point != edge->p) {
    // Next above or below edge?
    if (Orient2d(*edge->q, *node.next->point, *edge->p) == CCW) {
      // Below
      if (Orient2d(*node.point, *node.next->point, *node.next->next->point) == CCW) {
        // Next is concave
        FillRightConcaveEdgeEvent(tcx, edge, node);
      } else {
        // Next is convex
      }
    }
  }

}